

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-SFML.cpp
# Opt level: O1

void ImGui::DrawLine(Vector2f *a,Vector2f *b,Color *color,float thickness)

{
  Color CVar1;
  ImVec2 IVar2;
  ImU32 col;
  ImDrawList *this;
  ImVec2 local_40;
  ImVec2 local_38;
  ImVec4 local_30;
  
  this = GetWindowDrawList();
  IVar2 = GetCursorScreenPos();
  local_38.x = a->x + IVar2.x;
  local_38.y = a->y + IVar2.y;
  local_40.x = b->x + IVar2.x;
  local_40.y = IVar2.y + b->y;
  CVar1 = *color;
  local_30.x = (float)((uint)CVar1 & 0xff) * 0.003921569;
  local_30.y = (float)((uint)CVar1 >> 8 & 0xff) * 0.003921569;
  local_30.z = (float)((uint)CVar1 >> 0x10 & 0xff) * 0.003921569;
  local_30.w = (float)((uint)CVar1 >> 0x18) * 0.003921569;
  col = ColorConvertFloat4ToU32(&local_30);
  ImDrawList::AddLine(this,&local_38,&local_40,col,thickness);
  return;
}

Assistant:

void DrawLine(const sf::Vector2f& a, const sf::Vector2f& b, const sf::Color& color,
              float thickness) {
    ImDrawList* draw_list = ImGui::GetWindowDrawList();
    ImVec2 pos = ImGui::GetCursorScreenPos();
    draw_list->AddLine(ImVec2(a.x + pos.x, a.y + pos.y), ImVec2(b.x + pos.x, b.y + pos.y),
                       ColorConvertFloat4ToU32(toImColor(color)), thickness);
}